

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O0

int OPENSSL_lh_insert(_LHASH *lh,void **old_data,void *data,lhash_hash_func_helper call_hash_func,
                     lhash_cmp_func_helper call_cmp_func)

{
  LHASH_ITEM **ppLVar1;
  LHASH_ITEM *pLVar2;
  LHASH_ITEM *item;
  LHASH_ITEM **next_ptr;
  lhash_cmp_func_helper p_Stack_38;
  uint32_t hash;
  lhash_cmp_func_helper call_cmp_func_local;
  lhash_hash_func_helper call_hash_func_local;
  void *data_local;
  void **old_data_local;
  _LHASH *lh_local;
  
  *old_data = (void *)0x0;
  p_Stack_38 = call_cmp_func;
  call_cmp_func_local = (lhash_cmp_func_helper)call_hash_func;
  call_hash_func_local = (lhash_hash_func_helper)data;
  data_local = old_data;
  old_data_local = (void **)lh;
  ppLVar1 = get_next_ptr_and_hash
                      (lh,(uint32_t *)((long)&next_ptr + 4),data,call_hash_func,call_cmp_func);
  if (*ppLVar1 == (LHASH_ITEM *)0x0) {
    pLVar2 = (LHASH_ITEM *)OPENSSL_malloc(0x18);
    if (pLVar2 == (LHASH_ITEM *)0x0) {
      lh_local._4_4_ = 0;
    }
    else {
      pLVar2->data = call_hash_func_local;
      pLVar2->hash = next_ptr._4_4_;
      pLVar2->next = (lhash_item_st *)0x0;
      *ppLVar1 = pLVar2;
      *old_data_local = (void *)((long)*old_data_local + 1);
      lh_maybe_resize((_LHASH *)old_data_local);
      lh_local._4_4_ = 1;
    }
  }
  else {
    *(void **)data_local = (*ppLVar1)->data;
    (*ppLVar1)->data = call_hash_func_local;
    lh_local._4_4_ = 1;
  }
  return lh_local._4_4_;
}

Assistant:

int OPENSSL_lh_insert(_LHASH *lh, void **old_data, void *data,
                      lhash_hash_func_helper call_hash_func,
                      lhash_cmp_func_helper call_cmp_func) {
  uint32_t hash;
  LHASH_ITEM **next_ptr, *item;

  *old_data = NULL;
  next_ptr =
      get_next_ptr_and_hash(lh, &hash, data, call_hash_func, call_cmp_func);


  if (*next_ptr != NULL) {
    // An element equal to |data| already exists in the hash table. It will be
    // replaced.
    *old_data = (*next_ptr)->data;
    (*next_ptr)->data = data;
    return 1;
  }

  // An element equal to |data| doesn't exist in the hash table yet.
  item = reinterpret_cast<LHASH_ITEM *>(OPENSSL_malloc(sizeof(LHASH_ITEM)));
  if (item == NULL) {
    return 0;
  }

  item->data = data;
  item->hash = hash;
  item->next = NULL;
  *next_ptr = item;
  lh->num_items++;
  lh_maybe_resize(lh);

  return 1;
}